

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::Mine::Mine(Mine *this)

{
  _Rb_tree_header *p_Var1;
  
  MinefieldDataFilter::MinefieldDataFilter(&this->super_MinefieldDataFilter);
  (this->super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__Mine_0022d278;
  Vector::Vector(&this->m_Loc);
  this->m_ui16ID = 0;
  this->m_f32GrndOffset = 0.0;
  this->m_f32WtrOffset = 0.0;
  this->m_f32SnwOffset = 0.0;
  EulerAngles::EulerAngles(&this->m_Ori);
  this->m_f32ThrmCont = 0.0;
  this->m_f32Rflt = 0.0;
  ClockTime::ClockTime(&this->m_MET);
  MineFusing::MineFusing(&this->m_MF);
  (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MinePaintScheme::MinePaintScheme(&this->m_MPS);
  this->m_ui8NumTrpDetWrs = '\0';
  p_Var1 = &(this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header;
  (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ui16NextIndex = 0;
  return;
}

Assistant:

Mine::Mine() :
    m_ui16ID( 0 ),
    m_f32GrndOffset( 0 ),
    m_f32WtrOffset( 0 ),
    m_f32SnwOffset( 0 ),
    m_f32ThrmCont( 0 ),
    m_f32Rflt( 0 ),
    m_ui8NumTrpDetWrs( 0 ),
    m_ui16NextIndex( 0 )
{
}